

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv_os_uname(uv_utsname_t *buffer)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  int local_1a4;
  undefined1 local_19e [2];
  int r;
  utsname buf;
  uv_utsname_t *buffer_local;
  
  if (buffer == (uv_utsname_t *)0x0) {
    buffer_local._4_4_ = -0x16;
  }
  else {
    buf.domainname._57_8_ = buffer;
    iVar1 = uname((utsname *)local_19e);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      local_1a4 = -*piVar2;
    }
    else {
      sVar3 = uv__strscpy((char *)buf.domainname._57_8_,local_19e,0x100);
      if ((int)sVar3 == -7) {
        local_1a4 = -7;
      }
      else {
        sVar3 = uv__strscpy((char *)(buf.domainname._57_8_ + 0x100),buf.nodename + 0x39,0x100);
        if ((int)sVar3 == -7) {
          local_1a4 = -7;
        }
        else {
          sVar3 = uv__strscpy((char *)(buf.domainname._57_8_ + 0x200),buf.release + 0x39,0x100);
          if ((int)sVar3 == -7) {
            local_1a4 = -7;
          }
          else {
            sVar3 = uv__strscpy((char *)(buf.domainname._57_8_ + 0x300),buf.version + 0x39,0x100);
            if ((int)sVar3 != -7) {
              return 0;
            }
            local_1a4 = -7;
          }
        }
      }
    }
    *(undefined1 *)buf.domainname._57_8_ = 0;
    *(undefined1 *)(buf.domainname._57_8_ + 0x100) = 0;
    *(undefined1 *)(buf.domainname._57_8_ + 0x200) = 0;
    *(undefined1 *)(buf.domainname._57_8_ + 0x300) = 0;
    buffer_local._4_4_ = local_1a4;
  }
  return buffer_local._4_4_;
}

Assistant:

int uv_os_uname(uv_utsname_t* buffer) {
  struct utsname buf;
  int r;

  if (buffer == NULL)
    return UV_EINVAL;

  if (uname(&buf) == -1) {
    r = UV__ERR(errno);
    goto error;
  }

  r = uv__strscpy(buffer->sysname, buf.sysname, sizeof(buffer->sysname));
  if (r == UV_E2BIG)
    goto error;

#ifdef _AIX
  r = snprintf(buffer->release,
               sizeof(buffer->release),
               "%s.%s",
               buf.version,
               buf.release);
  if (r >= sizeof(buffer->release)) {
    r = UV_E2BIG;
    goto error;
  }
#else
  r = uv__strscpy(buffer->release, buf.release, sizeof(buffer->release));
  if (r == UV_E2BIG)
    goto error;
#endif

  r = uv__strscpy(buffer->version, buf.version, sizeof(buffer->version));
  if (r == UV_E2BIG)
    goto error;

#if defined(_AIX) || defined(__PASE__)
  r = uv__strscpy(buffer->machine, "ppc64", sizeof(buffer->machine));
#else
  r = uv__strscpy(buffer->machine, buf.machine, sizeof(buffer->machine));
#endif

  if (r == UV_E2BIG)
    goto error;

  return 0;

error:
  buffer->sysname[0] = '\0';
  buffer->release[0] = '\0';
  buffer->version[0] = '\0';
  buffer->machine[0] = '\0';
  return r;
}